

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::ResonanceChannels::verifySize
               (int NPL,int NCH)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>(in_RAX);
  }
  else {
    if (NCH < 1) {
      tools::Log::error<char_const*>(in_RAX);
      tools::Log::info<char_const*>(in_RAX);
      goto LAB_00128ced;
    }
    if (((double)NPL / 6.0 == (double)NCH) && (!NAN((double)NPL / 6.0) && !NAN((double)NCH))) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
  }
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_00128ced:
  tools::Log::info<char_const*,int>("NCH value: {}",NCH);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NCH ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 6 * NCH" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NCH value: {}", NCH );
    throw std::exception();
  }

  if ( NCH < 1 ) {

    Log::error( "Encountered illegal NCH value" );
    Log::info( "NCH should be larger than zero" );
    Log::info( "NCH value: {}", NCH );
    throw std::exception();
  }

  if ( NPL / 6. != NCH ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NCH" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NCH value: {}", NCH );
    throw std::exception();
  }
}